

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetPipelineShadingRateFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_SHADING_RATE_FLAGS Flags)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  string msg;
  string local_50;
  
  if ((int)this == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NONE",(allocator *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = (ulong)this & 0xffffffff;
    while (bVar1 = (byte)uVar2, bVar1 != 0) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      bVar3 = -bVar1 & bVar1;
      if ((bVar3 != 1) && (bVar3 != 2)) {
        FormatString<char[33]>(&local_50,(char (*) [33])"Unexpected pipeline shading rate");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"GetPipelineShadingRateFlagsString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0xaf7);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = (ulong)(bVar1 ^ bVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetPipelineShadingRateFlagsString(PIPELINE_SHADING_RATE_FLAGS Flags)
{
    if (Flags == PIPELINE_SHADING_RATE_FLAG_NONE)
        return "NONE";

    String Result;
    while (Flags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        PIPELINE_SHADING_RATE_FLAGS Bit = ExtractLSB(Flags);

        if (!Result.empty())
            Result += " | ";

        static_assert(PIPELINE_SHADING_RATE_FLAG_LAST == 0x02, "Please update the switch below to handle the new pipeline shading rate flag");
        switch (Bit)
        {
            // clang-format off
            case PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE: Result += "PER_PRIMITIVE"; break;
            case PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED: Result += "TEXTURE_BASED"; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected pipeline shading rate");
                Result += "Unknown";
        }
    }
    return Result;
}